

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O2

void __thiscall Centaurus::ATNNode<char>::ATNNode(ATNNode<char> *this,Stream *stream)

{
  this->_vptr_ATNNode = (_func_int **)&PTR__ATNNode_00199180;
  (this->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_invoke)._vptr_Identifier = (_func_int **)&PTR__Identifier_00198ce8;
  (this->m_invoke).m_id._M_dataplus._M_p = (pointer)&(this->m_invoke).m_id.field_2;
  (this->m_invoke).m_id._M_string_length = 0;
  (this->m_invoke).m_id.field_2._M_local_buf[0] = L'\0';
  NFA<char>::NFA(&this->m_nfa);
  (this->m_literal)._M_dataplus._M_p = (pointer)&(this->m_literal).field_2;
  (this->m_literal)._M_string_length = 0;
  (this->m_literal).field_2._M_local_buf[0] = '\0';
  parse(this,stream);
  return;
}

Assistant:

ATNNode(Stream& stream)
    {
        parse(stream);
    }